

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_16x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ushort uVar17;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar18;
  ushort uVar25;
  ushort uVar29;
  ushort uVar33;
  ushort uVar37;
  ushort uVar41;
  ushort uVar45;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar24 [16];
  int y_mask_2;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  int y_mask;
  __m128i top_hi;
  __m128i top_lo;
  __m128i top;
  __m128i round;
  __m128i scaled_bottom_left4;
  __m128i scaled_bottom_left3;
  __m128i scaled_bottom_left2;
  __m128i scaled_bottom_left1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i zero;
  __m128i scale;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i bottom_left;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_f9c;
  int local_f5c;
  int local_f1c;
  int local_edc;
  undefined8 *local_d70;
  byte bStack_c30;
  byte bStack_c2f;
  byte bStack_c2e;
  byte bStack_c2d;
  byte bStack_c2c;
  byte bStack_c2b;
  byte bStack_c2a;
  byte bStack_c29;
  byte local_bb8;
  byte bStack_bb7;
  byte bStack_bb6;
  byte bStack_bb5;
  byte bStack_bb4;
  byte bStack_bb3;
  byte bStack_bb2;
  byte bStack_bb1;
  ushort uStack_aa2;
  ushort uStack_a9a;
  ushort uStack_a82;
  ushort uStack_a7a;
  ushort uStack_a62;
  ushort uStack_a5a;
  ushort uStack_a46;
  ushort uStack_a44;
  ushort uStack_a42;
  ushort uStack_a3e;
  ushort uStack_a3c;
  ushort uStack_a3a;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  ushort uStack_866;
  ushort uStack_864;
  ushort uStack_862;
  ushort uStack_85e;
  ushort uStack_85c;
  ushort uStack_85a;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  ushort uStack_846;
  ushort uStack_844;
  ushort uStack_842;
  ushort uStack_83e;
  ushort uStack_83c;
  ushort uStack_83a;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_690;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  ushort uStack_686;
  ushort uStack_684;
  ushort uStack_682;
  ushort uStack_67e;
  ushort uStack_67c;
  ushort uStack_67a;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  ushort uStack_4e6;
  ushort uStack_4e4;
  ushort uStack_4e2;
  ushort uStack_4de;
  ushort uStack_4dc;
  ushort uStack_4da;
  short local_4d8;
  short sStack_4d6;
  short sStack_4d4;
  short sStack_4d2;
  short sStack_4d0;
  short sStack_4ce;
  short sStack_4cc;
  short sStack_4ca;
  ushort uStack_4c6;
  ushort uStack_4c4;
  ushort uStack_4c2;
  ushort uStack_4be;
  ushort uStack_4bc;
  ushort uStack_4ba;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  ushort uStack_326;
  ushort uStack_324;
  ushort uStack_322;
  ushort uStack_31e;
  ushort uStack_31c;
  ushort uStack_31a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  ushort uStack_306;
  ushort uStack_304;
  ushort uStack_302;
  ushort uStack_2fe;
  ushort uStack_2fc;
  ushort uStack_2fa;
  __m128i scaled_bottom_left_y_3;
  __m128i weights_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i scaled_bottom_left_y_2;
  __m128i weights_y_2;
  __m128i y_select_2;
  
  bVar1 = *(byte *)(in_RCX + 0x1f);
  uVar17 = CONCAT11(0,bVar1);
  uStack_a46 = (ushort)bVar1;
  uStack_a44 = (ushort)bVar1;
  uStack_a42 = (ushort)bVar1;
  uStack_a3e = (ushort)bVar1;
  uStack_a3c = (ushort)bVar1;
  uStack_a3a = (ushort)bVar1;
  uStack_a62 = (ushort)bVar1;
  uStack_a5a = (ushort)bVar1;
  uStack_a82 = (ushort)bVar1;
  uStack_a7a = (ushort)bVar1;
  uStack_aa2 = (ushort)bVar1;
  uStack_a9a = (ushort)bVar1;
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  local_bb8 = (byte)uVar2;
  bStack_bb7 = (byte)((ulong)uVar2 >> 8);
  bStack_bb6 = (byte)((ulong)uVar2 >> 0x10);
  bStack_bb5 = (byte)((ulong)uVar2 >> 0x18);
  bStack_bb4 = (byte)((ulong)uVar2 >> 0x20);
  bStack_bb3 = (byte)((ulong)uVar2 >> 0x28);
  bStack_bb2 = (byte)((ulong)uVar2 >> 0x30);
  bStack_bb1 = (byte)((ulong)uVar2 >> 0x38);
  bStack_c30 = (byte)uVar3;
  bStack_c2f = (byte)((ulong)uVar3 >> 8);
  bStack_c2e = (byte)((ulong)uVar3 >> 0x10);
  bStack_c2d = (byte)((ulong)uVar3 >> 0x18);
  bStack_c2c = (byte)((ulong)uVar3 >> 0x20);
  bStack_c2b = (byte)((ulong)uVar3 >> 0x28);
  bStack_c2a = (byte)((ulong)uVar3 >> 0x30);
  bStack_c29 = (byte)((ulong)uVar3 >> 0x38);
  local_d70 = in_RDI;
  for (local_edc = 0x1000100; local_edc < 0xf0e0f0f; local_edc = local_edc + 0x2020202) {
    auVar16._8_7_ = 0x9d00a900b600c4;
    auVar16._0_8_ = 0xd200e100f000ff;
    auVar16[0xf] = 0;
    auVar15._8_8_ = CONCAT44(local_edc,local_edc);
    auVar15._0_8_ = CONCAT44(local_edc,local_edc);
    auVar22 = pshufb(auVar16,auVar15);
    auVar14._2_2_ = uStack_a46 * 0x10;
    auVar14._0_2_ = uVar17;
    auVar14._4_2_ = uStack_a44 * 0x1f;
    auVar14._6_2_ = uStack_a42 * 0x2e;
    auVar14._10_2_ = uStack_a3e * 0x4a;
    auVar14._8_2_ = uVar17 * 0x3c;
    auVar14._12_2_ = uStack_a3c * 0x57;
    auVar14._14_2_ = uStack_a3a * 99;
    auVar13._8_8_ = CONCAT44(local_edc,local_edc);
    auVar13._0_8_ = CONCAT44(local_edc,local_edc);
    auVar23 = pshufb(auVar14,auVar13);
    uStack_306 = (ushort)bStack_bb7;
    uStack_304 = (ushort)bStack_bb6;
    uStack_302 = (ushort)bStack_bb5;
    uStack_2fe = (ushort)bStack_bb3;
    uStack_2fc = (ushort)bStack_bb2;
    uStack_2fa = (ushort)bStack_bb1;
    local_318 = auVar22._0_2_;
    sStack_316 = auVar22._2_2_;
    sStack_314 = auVar22._4_2_;
    sStack_312 = auVar22._6_2_;
    sStack_310 = auVar22._8_2_;
    sStack_30e = auVar22._10_2_;
    sStack_30c = auVar22._12_2_;
    sStack_30a = auVar22._14_2_;
    uStack_326 = (ushort)bStack_c2f;
    uStack_324 = (ushort)bStack_c2e;
    uStack_322 = (ushort)bStack_c2d;
    uStack_31e = (ushort)bStack_c2b;
    uStack_31c = (ushort)bStack_c2a;
    uStack_31a = (ushort)bStack_c29;
    local_348 = auVar23._0_2_;
    sStack_346 = auVar23._2_2_;
    sStack_344 = auVar23._4_2_;
    sStack_342 = auVar23._6_2_;
    sStack_340 = auVar23._8_2_;
    sStack_33e = auVar23._10_2_;
    sStack_33c = auVar23._12_2_;
    sStack_33a = auVar23._14_2_;
    uVar18 = local_348 + (ushort)local_bb8 * local_318 + 0x80;
    uVar25 = sStack_346 + uStack_306 * sStack_316 + 0x80;
    uVar29 = sStack_344 + uStack_304 * sStack_314 + 0x80;
    uVar33 = sStack_342 + uStack_302 * sStack_312 + 0x80;
    uVar37 = sStack_340 + (ushort)bStack_bb4 * sStack_310 + 0x80;
    uVar41 = sStack_33e + uStack_2fe * sStack_30e + 0x80;
    uVar45 = sStack_33c + uStack_2fc * sStack_30c + 0x80;
    uVar49 = sStack_33a + uStack_2fa * sStack_30a + 0x80;
    uVar19 = uVar18 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar20 = local_348 + (ushort)bStack_c30 * local_318 + 0x80;
    uVar27 = sStack_346 + uStack_326 * sStack_316 + 0x80;
    uVar31 = sStack_344 + uStack_324 * sStack_314 + 0x80;
    uVar35 = sStack_342 + uStack_322 * sStack_312 + 0x80;
    uVar39 = sStack_340 + (ushort)bStack_c2c * sStack_310 + 0x80;
    uVar43 = sStack_33e + uStack_31e * sStack_30e + 0x80;
    uVar47 = sStack_33c + uStack_31c * sStack_30c + 0x80;
    uVar51 = sStack_33a + uStack_31a * sStack_30a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    *local_d70 = CONCAT17((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                          CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                   (0xff < uVar46),
                                   CONCAT15((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                            (0xff < uVar42),
                                            CONCAT14((uVar38 != 0) * (uVar38 < 0x100) *
                                                     (char)(uVar37 >> 8) - (0xff < uVar38),
                                                     CONCAT13((uVar34 != 0) * (uVar34 < 0x100) *
                                                              (char)(uVar33 >> 8) - (0xff < uVar34),
                                                              CONCAT12((uVar30 != 0) *
                                                                       (uVar30 < 0x100) *
                                                                       (char)(uVar29 >> 8) -
                                                                       (0xff < uVar30),
                                                                       CONCAT11((uVar26 != 0) *
                                                                                (uVar26 < 0x100) *
                                                                                (char)(uVar25 >> 8)
                                                                                - (0xff < uVar26),
                                                                                (uVar19 != 0) *
                                                                                (uVar19 < 0x100) *
                                                                                (char)(uVar18 >> 8)
                                                                                - (0xff < uVar19))))
                                                    ))));
    local_d70[1] = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52)
                            ,CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                      (0xff < uVar48),
                                      CONCAT15((uVar44 != 0) * (uVar44 < 0x100) *
                                               (char)(uVar43 >> 8) - (0xff < uVar44),
                                               CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                        (char)(uVar39 >> 8) - (0xff < uVar40),
                                                        CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                                 (char)(uVar35 >> 8) -
                                                                 (0xff < uVar36),
                                                                 CONCAT12((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)(uVar31 >> 8) -
                                                                          (0xff < uVar32),
                                                                          CONCAT11((uVar28 != 0) *
                                                                                   (uVar28 < 0x100)
                                                                                   * (char)(uVar27 
                                                  >> 8) - (0xff < uVar28),
                                                  (uVar21 != 0) * (uVar21 < 0x100) *
                                                  (char)(uVar20 >> 8) - (0xff < uVar21))))))));
    local_d70 = (undefined8 *)(in_RSI + (long)local_d70);
  }
  for (local_f1c = 0x1000100; local_f1c < 0xf0e0f0f; local_f1c = local_f1c + 0x2020202) {
    auVar12._8_7_ = 0x4a0053005c0065;
    auVar12._0_8_ = 0x6f007a00850091;
    auVar12[0xf] = 0;
    auVar11._8_8_ = CONCAT44(local_f1c,local_f1c);
    auVar11._0_8_ = CONCAT44(local_f1c,local_f1c);
    auVar22 = pshufb(auVar12,auVar11);
    auVar10._2_2_ = uStack_a46 * 0x7b;
    auVar10._0_2_ = uVar17 * 0x6f;
    auVar10._4_2_ = uStack_a44 * 0x86;
    auVar10._6_2_ = uStack_a62 * 0x91;
    auVar10._10_2_ = uStack_a3e * 0xa4;
    auVar10._8_2_ = uVar17 * 0x9b;
    auVar10._12_2_ = uStack_a3c * 0xad;
    auVar10._14_2_ = uStack_a5a * 0xb6;
    auVar9._8_8_ = CONCAT44(local_f1c,local_f1c);
    auVar9._0_8_ = CONCAT44(local_f1c,local_f1c);
    auVar23 = pshufb(auVar10,auVar9);
    uStack_4c6 = (ushort)bStack_bb7;
    uStack_4c4 = (ushort)bStack_bb6;
    uStack_4c2 = (ushort)bStack_bb5;
    uStack_4be = (ushort)bStack_bb3;
    uStack_4bc = (ushort)bStack_bb2;
    uStack_4ba = (ushort)bStack_bb1;
    local_4d8 = auVar22._0_2_;
    sStack_4d6 = auVar22._2_2_;
    sStack_4d4 = auVar22._4_2_;
    sStack_4d2 = auVar22._6_2_;
    sStack_4d0 = auVar22._8_2_;
    sStack_4ce = auVar22._10_2_;
    sStack_4cc = auVar22._12_2_;
    sStack_4ca = auVar22._14_2_;
    uStack_4e6 = (ushort)bStack_c2f;
    uStack_4e4 = (ushort)bStack_c2e;
    uStack_4e2 = (ushort)bStack_c2d;
    uStack_4de = (ushort)bStack_c2b;
    uStack_4dc = (ushort)bStack_c2a;
    uStack_4da = (ushort)bStack_c29;
    local_508 = auVar23._0_2_;
    sStack_506 = auVar23._2_2_;
    sStack_504 = auVar23._4_2_;
    sStack_502 = auVar23._6_2_;
    sStack_500 = auVar23._8_2_;
    sStack_4fe = auVar23._10_2_;
    sStack_4fc = auVar23._12_2_;
    sStack_4fa = auVar23._14_2_;
    uVar18 = local_508 + (ushort)local_bb8 * local_4d8 + 0x80;
    uVar25 = sStack_506 + uStack_4c6 * sStack_4d6 + 0x80;
    uVar29 = sStack_504 + uStack_4c4 * sStack_4d4 + 0x80;
    uVar33 = sStack_502 + uStack_4c2 * sStack_4d2 + 0x80;
    uVar37 = sStack_500 + (ushort)bStack_bb4 * sStack_4d0 + 0x80;
    uVar41 = sStack_4fe + uStack_4be * sStack_4ce + 0x80;
    uVar45 = sStack_4fc + uStack_4bc * sStack_4cc + 0x80;
    uVar49 = sStack_4fa + uStack_4ba * sStack_4ca + 0x80;
    uVar19 = uVar18 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar20 = local_508 + (ushort)bStack_c30 * local_4d8 + 0x80;
    uVar27 = sStack_506 + uStack_4e6 * sStack_4d6 + 0x80;
    uVar31 = sStack_504 + uStack_4e4 * sStack_4d4 + 0x80;
    uVar35 = sStack_502 + uStack_4e2 * sStack_4d2 + 0x80;
    uVar39 = sStack_500 + (ushort)bStack_c2c * sStack_4d0 + 0x80;
    uVar43 = sStack_4fe + uStack_4de * sStack_4ce + 0x80;
    uVar47 = sStack_4fc + uStack_4dc * sStack_4cc + 0x80;
    uVar51 = sStack_4fa + uStack_4da * sStack_4ca + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    *local_d70 = CONCAT17((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                          CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                   (0xff < uVar46),
                                   CONCAT15((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                            (0xff < uVar42),
                                            CONCAT14((uVar38 != 0) * (uVar38 < 0x100) *
                                                     (char)(uVar37 >> 8) - (0xff < uVar38),
                                                     CONCAT13((uVar34 != 0) * (uVar34 < 0x100) *
                                                              (char)(uVar33 >> 8) - (0xff < uVar34),
                                                              CONCAT12((uVar30 != 0) *
                                                                       (uVar30 < 0x100) *
                                                                       (char)(uVar29 >> 8) -
                                                                       (0xff < uVar30),
                                                                       CONCAT11((uVar26 != 0) *
                                                                                (uVar26 < 0x100) *
                                                                                (char)(uVar25 >> 8)
                                                                                - (0xff < uVar26),
                                                                                (uVar19 != 0) *
                                                                                (uVar19 < 0x100) *
                                                                                (char)(uVar18 >> 8)
                                                                                - (0xff < uVar19))))
                                                    ))));
    local_d70[1] = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52)
                            ,CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                      (0xff < uVar48),
                                      CONCAT15((uVar44 != 0) * (uVar44 < 0x100) *
                                               (char)(uVar43 >> 8) - (0xff < uVar44),
                                               CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                        (char)(uVar39 >> 8) - (0xff < uVar40),
                                                        CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                                 (char)(uVar35 >> 8) -
                                                                 (0xff < uVar36),
                                                                 CONCAT12((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)(uVar31 >> 8) -
                                                                          (0xff < uVar32),
                                                                          CONCAT11((uVar28 != 0) *
                                                                                   (uVar28 < 0x100)
                                                                                   * (char)(uVar27 
                                                  >> 8) - (0xff < uVar28),
                                                  (uVar21 != 0) * (uVar21 < 0x100) *
                                                  (char)(uVar20 >> 8) - (0xff < uVar21))))))));
    local_d70 = (undefined8 *)(in_RSI + (long)local_d70);
  }
  for (local_f5c = 0x1000100; local_f5c < 0xf0e0f0f; local_f5c = local_f5c + 0x2020202) {
    auVar8._8_7_ = 0x19001d00220027;
    auVar8._0_8_ = 0x2d0034003b0042;
    auVar8[0xf] = 0;
    auVar7._8_8_ = CONCAT44(local_f5c,local_f5c);
    auVar7._0_8_ = CONCAT44(local_f5c,local_f5c);
    auVar22 = pshufb(auVar8,auVar7);
    auVar6._2_2_ = uStack_a46 * 0xc5;
    auVar6._0_2_ = uVar17 * 0xbe;
    auVar6._4_2_ = uStack_a44 * 0xcc;
    auVar6._6_2_ = uStack_a82 * 0xd3;
    auVar6._10_2_ = uStack_a3e * 0xde;
    auVar6._8_2_ = uVar17 * 0xd9;
    auVar6._12_2_ = uStack_a3c * 0xe3;
    auVar6._14_2_ = uStack_a7a * 0xe7;
    auVar5._8_8_ = CONCAT44(local_f5c,local_f5c);
    auVar5._0_8_ = CONCAT44(local_f5c,local_f5c);
    auVar23 = pshufb(auVar6,auVar5);
    uStack_686 = (ushort)bStack_bb7;
    uStack_684 = (ushort)bStack_bb6;
    uStack_682 = (ushort)bStack_bb5;
    uStack_67e = (ushort)bStack_bb3;
    uStack_67c = (ushort)bStack_bb2;
    uStack_67a = (ushort)bStack_bb1;
    local_698 = auVar22._0_2_;
    sStack_696 = auVar22._2_2_;
    sStack_694 = auVar22._4_2_;
    sStack_692 = auVar22._6_2_;
    sStack_690 = auVar22._8_2_;
    sStack_68e = auVar22._10_2_;
    sStack_68c = auVar22._12_2_;
    sStack_68a = auVar22._14_2_;
    uStack_6a6 = (ushort)bStack_c2f;
    uStack_6a4 = (ushort)bStack_c2e;
    uStack_6a2 = (ushort)bStack_c2d;
    uStack_69e = (ushort)bStack_c2b;
    uStack_69c = (ushort)bStack_c2a;
    uStack_69a = (ushort)bStack_c29;
    local_6c8 = auVar23._0_2_;
    sStack_6c6 = auVar23._2_2_;
    sStack_6c4 = auVar23._4_2_;
    sStack_6c2 = auVar23._6_2_;
    sStack_6c0 = auVar23._8_2_;
    sStack_6be = auVar23._10_2_;
    sStack_6bc = auVar23._12_2_;
    sStack_6ba = auVar23._14_2_;
    uVar18 = local_6c8 + (ushort)local_bb8 * local_698 + 0x80;
    uVar25 = sStack_6c6 + uStack_686 * sStack_696 + 0x80;
    uVar29 = sStack_6c4 + uStack_684 * sStack_694 + 0x80;
    uVar33 = sStack_6c2 + uStack_682 * sStack_692 + 0x80;
    uVar37 = sStack_6c0 + (ushort)bStack_bb4 * sStack_690 + 0x80;
    uVar41 = sStack_6be + uStack_67e * sStack_68e + 0x80;
    uVar45 = sStack_6bc + uStack_67c * sStack_68c + 0x80;
    uVar49 = sStack_6ba + uStack_67a * sStack_68a + 0x80;
    uVar19 = uVar18 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar20 = local_6c8 + (ushort)bStack_c30 * local_698 + 0x80;
    uVar27 = sStack_6c6 + uStack_6a6 * sStack_696 + 0x80;
    uVar31 = sStack_6c4 + uStack_6a4 * sStack_694 + 0x80;
    uVar35 = sStack_6c2 + uStack_6a2 * sStack_692 + 0x80;
    uVar39 = sStack_6c0 + (ushort)bStack_c2c * sStack_690 + 0x80;
    uVar43 = sStack_6be + uStack_69e * sStack_68e + 0x80;
    uVar47 = sStack_6bc + uStack_69c * sStack_68c + 0x80;
    uVar51 = sStack_6ba + uStack_69a * sStack_68a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    *local_d70 = CONCAT17((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                          CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                   (0xff < uVar46),
                                   CONCAT15((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                            (0xff < uVar42),
                                            CONCAT14((uVar38 != 0) * (uVar38 < 0x100) *
                                                     (char)(uVar37 >> 8) - (0xff < uVar38),
                                                     CONCAT13((uVar34 != 0) * (uVar34 < 0x100) *
                                                              (char)(uVar33 >> 8) - (0xff < uVar34),
                                                              CONCAT12((uVar30 != 0) *
                                                                       (uVar30 < 0x100) *
                                                                       (char)(uVar29 >> 8) -
                                                                       (0xff < uVar30),
                                                                       CONCAT11((uVar26 != 0) *
                                                                                (uVar26 < 0x100) *
                                                                                (char)(uVar25 >> 8)
                                                                                - (0xff < uVar26),
                                                                                (uVar19 != 0) *
                                                                                (uVar19 < 0x100) *
                                                                                (char)(uVar18 >> 8)
                                                                                - (0xff < uVar19))))
                                                    ))));
    local_d70[1] = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52)
                            ,CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                      (0xff < uVar48),
                                      CONCAT15((uVar44 != 0) * (uVar44 < 0x100) *
                                               (char)(uVar43 >> 8) - (0xff < uVar44),
                                               CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                        (char)(uVar39 >> 8) - (0xff < uVar40),
                                                        CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                                 (char)(uVar35 >> 8) -
                                                                 (0xff < uVar36),
                                                                 CONCAT12((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)(uVar31 >> 8) -
                                                                          (0xff < uVar32),
                                                                          CONCAT11((uVar28 != 0) *
                                                                                   (uVar28 < 0x100)
                                                                                   * (char)(uVar27 
                                                  >> 8) - (0xff < uVar28),
                                                  (uVar21 != 0) * (uVar21 < 0x100) *
                                                  (char)(uVar20 >> 8) - (0xff < uVar21))))))));
    local_d70 = (undefined8 *)(in_RSI + (long)local_d70);
  }
  for (local_f9c = 0x1000100; local_f9c < 0xf0e0f0f; local_f9c = local_f9c + 0x2020202) {
    auVar4._8_7_ = 0x800080009000a;
    auVar4._0_8_ = 0xc000e00110015;
    auVar4[0xf] = 0;
    auVar24._8_8_ = CONCAT44(local_f9c,local_f9c);
    auVar24._0_8_ = CONCAT44(local_f9c,local_f9c);
    auVar24 = pshufb(auVar4,auVar24);
    auVar23._2_2_ = uStack_a46 * 0xef;
    auVar23._0_2_ = uVar17 * 0xeb;
    auVar23._4_2_ = uStack_a44 * 0xf2;
    auVar23._6_2_ = uStack_aa2 * 0xf4;
    auVar23._10_2_ = uStack_a3e * 0xf7;
    auVar23._8_2_ = uVar17 * 0xf6;
    auVar23._12_2_ = uStack_a3c * 0xf8;
    auVar23._14_2_ = uStack_a9a * 0xf8;
    auVar22._8_8_ = CONCAT44(local_f9c,local_f9c);
    auVar22._0_8_ = CONCAT44(local_f9c,local_f9c);
    auVar22 = pshufb(auVar23,auVar22);
    uStack_846 = (ushort)bStack_bb7;
    uStack_844 = (ushort)bStack_bb6;
    uStack_842 = (ushort)bStack_bb5;
    uStack_83e = (ushort)bStack_bb3;
    uStack_83c = (ushort)bStack_bb2;
    uStack_83a = (ushort)bStack_bb1;
    local_858 = auVar24._0_2_;
    sStack_856 = auVar24._2_2_;
    sStack_854 = auVar24._4_2_;
    sStack_852 = auVar24._6_2_;
    sStack_850 = auVar24._8_2_;
    sStack_84e = auVar24._10_2_;
    sStack_84c = auVar24._12_2_;
    sStack_84a = auVar24._14_2_;
    uStack_866 = (ushort)bStack_c2f;
    uStack_864 = (ushort)bStack_c2e;
    uStack_862 = (ushort)bStack_c2d;
    uStack_85e = (ushort)bStack_c2b;
    uStack_85c = (ushort)bStack_c2a;
    uStack_85a = (ushort)bStack_c29;
    local_888 = auVar22._0_2_;
    sStack_886 = auVar22._2_2_;
    sStack_884 = auVar22._4_2_;
    sStack_882 = auVar22._6_2_;
    sStack_880 = auVar22._8_2_;
    sStack_87e = auVar22._10_2_;
    sStack_87c = auVar22._12_2_;
    sStack_87a = auVar22._14_2_;
    uVar18 = local_888 + (ushort)local_bb8 * local_858 + 0x80;
    uVar25 = sStack_886 + uStack_846 * sStack_856 + 0x80;
    uVar29 = sStack_884 + uStack_844 * sStack_854 + 0x80;
    uVar33 = sStack_882 + uStack_842 * sStack_852 + 0x80;
    uVar37 = sStack_880 + (ushort)bStack_bb4 * sStack_850 + 0x80;
    uVar41 = sStack_87e + uStack_83e * sStack_84e + 0x80;
    uVar45 = sStack_87c + uStack_83c * sStack_84c + 0x80;
    uVar49 = sStack_87a + uStack_83a * sStack_84a + 0x80;
    uVar19 = uVar18 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar20 = local_888 + (ushort)bStack_c30 * local_858 + 0x80;
    uVar27 = sStack_886 + uStack_866 * sStack_856 + 0x80;
    uVar31 = sStack_884 + uStack_864 * sStack_854 + 0x80;
    uVar35 = sStack_882 + uStack_862 * sStack_852 + 0x80;
    uVar39 = sStack_880 + (ushort)bStack_c2c * sStack_850 + 0x80;
    uVar43 = sStack_87e + uStack_85e * sStack_84e + 0x80;
    uVar47 = sStack_87c + uStack_85c * sStack_84c + 0x80;
    uVar51 = sStack_87a + uStack_85a * sStack_84a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    *local_d70 = CONCAT17((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                          CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                   (0xff < uVar46),
                                   CONCAT15((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                            (0xff < uVar42),
                                            CONCAT14((uVar38 != 0) * (uVar38 < 0x100) *
                                                     (char)(uVar37 >> 8) - (0xff < uVar38),
                                                     CONCAT13((uVar34 != 0) * (uVar34 < 0x100) *
                                                              (char)(uVar33 >> 8) - (0xff < uVar34),
                                                              CONCAT12((uVar30 != 0) *
                                                                       (uVar30 < 0x100) *
                                                                       (char)(uVar29 >> 8) -
                                                                       (0xff < uVar30),
                                                                       CONCAT11((uVar26 != 0) *
                                                                                (uVar26 < 0x100) *
                                                                                (char)(uVar25 >> 8)
                                                                                - (0xff < uVar26),
                                                                                (uVar19 != 0) *
                                                                                (uVar19 < 0x100) *
                                                                                (char)(uVar18 >> 8)
                                                                                - (0xff < uVar19))))
                                                    ))));
    local_d70[1] = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52)
                            ,CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                      (0xff < uVar48),
                                      CONCAT15((uVar44 != 0) * (uVar44 < 0x100) *
                                               (char)(uVar43 >> 8) - (0xff < uVar44),
                                               CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                        (char)(uVar39 >> 8) - (0xff < uVar40),
                                                        CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                                 (char)(uVar35 >> 8) -
                                                                 (0xff < uVar36),
                                                                 CONCAT12((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)(uVar31 >> 8) -
                                                                          (0xff < uVar32),
                                                                          CONCAT11((uVar28 != 0) *
                                                                                   (uVar28 < 0x100)
                                                                                   * (char)(uVar27 
                                                  >> 8) - (0xff < uVar28),
                                                  (uVar21 != 0) * (uVar21 < 0x100) *
                                                  (char)(uVar20 >> 8) - (0xff < uVar21))))))));
    local_d70 = (undefined8 *)(in_RSI + (long)local_d70);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_16x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i zero = _mm_setzero_si128();
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(128);

  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}